

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void nlohmann::json_abi_v3_11_3::detail::dtoa_impl::grisu2_round
               (char *buf,int len,uint64_t dist,uint64_t delta,uint64_t rest,uint64_t ten_k)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (len < 1) {
    pcVar2 = "len >= 1";
    uVar3 = 0x4431;
  }
  else if (delta < dist) {
    pcVar2 = "dist <= delta";
    uVar3 = 0x4432;
  }
  else {
    uVar1 = delta - rest;
    if (delta < rest) {
      pcVar2 = "rest <= delta";
      uVar3 = 0x4433;
    }
    else if (ten_k == 0) {
      pcVar2 = "ten_k > 0";
      uVar3 = 0x4434;
    }
    else {
      uVar4 = dist - rest;
      while( true ) {
        if (((dist <= rest) || (bVar5 = uVar1 < ten_k, uVar1 = uVar1 - ten_k, bVar5)) ||
           ((dist <= rest + ten_k && (uVar4 <= rest + (ten_k - dist))))) {
          return;
        }
        if (buf[(ulong)(uint)len - 1] == '0') break;
        buf[(ulong)(uint)len - 1] = buf[(ulong)(uint)len - 1] + -1;
        uVar4 = uVar4 - ten_k;
        rest = rest + ten_k;
      }
      pcVar2 = "buf[len - 1] != \'0\'";
      uVar3 = 0x444d;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp",
             uVar3,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

inline void grisu2_round(char* buf, int len, std::uint64_t dist, std::uint64_t delta,
                         std::uint64_t rest, std::uint64_t ten_k)
{
    JSON_ASSERT(len >= 1);
    JSON_ASSERT(dist <= delta);
    JSON_ASSERT(rest <= delta);
    JSON_ASSERT(ten_k > 0);

    //               <--------------------------- delta ---->
    //                                  <---- dist --------->
    // --------------[------------------+-------------------]--------------
    //               M-                 w                   M+
    //
    //                                  ten_k
    //                                <------>
    //                                       <---- rest ---->
    // --------------[------------------+----+--------------]--------------
    //                                  w    V
    //                                       = buf * 10^k
    //
    // ten_k represents a unit-in-the-last-place in the decimal representation
    // stored in buf.
    // Decrement buf by ten_k while this takes buf closer to w.

    // The tests are written in this order to avoid overflow in unsigned
    // integer arithmetic.

    while (rest < dist
            && delta - rest >= ten_k
            && (rest + ten_k < dist || dist - rest > rest + ten_k - dist))
    {
        JSON_ASSERT(buf[len - 1] != '0');
        buf[len - 1]--;
        rest += ten_k;
    }
}